

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_doing(connectdata *conn,_Bool *dophase_done)

{
  CURLcode CVar1;
  bool bVar2;
  
  CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
  bVar2 = (conn->proto).ftpc.state == FTP_STOP;
  *dophase_done = bVar2;
  if (CVar1 == CURLE_OK && bVar2) {
    CVar1 = ftp_dophase_done(conn,false);
    return CVar1;
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_doing(struct connectdata *conn,
                          bool *dophase_done)
{
  CURLcode result = ftp_multi_statemach(conn, dophase_done);

  if(result)
    DEBUGF(infof(conn->data, "DO phase failed\n"));
  else if(*dophase_done) {
    result = ftp_dophase_done(conn, FALSE /* not connected */);

    DEBUGF(infof(conn->data, "DO phase is complete2\n"));
  }
  return result;
}